

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param-utils.cpp
# Opt level: O2

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::ParamUtils::localizeCallsTo::LocalizerPass::create(LocalizerPass *this)

{
  unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
  *callTargets;
  LocalizerPass *this_00;
  long in_RSI;
  
  callTargets = *(unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                  **)(in_RSI + 0x130);
  this_00 = (LocalizerPass *)operator_new(0x140);
  localizeCallsTo(std::unordered_set<wasm::HeapType,std::hash<wasm::HeapType>,std::equal_to<wasm::
  HeapType>,std::allocator<wasm::HeapType>>const&,wasm::Module&,wasm::PassRunner*)::LocalizerPass::
  LocalizerPass(std::unordered_set<wasm::HeapType,std::hash<wasm::HeapType>,std::equal_to<wasm::
  HeapType>,std::allocator<wasm::HeapType>_>_const__(this_00,callTargets);
  (this->super_WalkerPass<wasm::PostWalker<LocalizerPass,_wasm::Visitor<LocalizerPass,_void>_>_>).
  super_Pass._vptr_Pass = (_func_int **)this_00;
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
      return std::make_unique<LocalizerPass>(callTargets);
    }